

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

bool __thiscall
cmUVProcessChain::InternalData::AddCommand
          (InternalData *this,ProcessConfiguration *config,bool first,bool last)

{
  anon_union_8_2_26168aa3_for_data aVar1;
  undefined4 uVar2;
  ProcessConfiguration *this_00;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  type data;
  reference pvVar6;
  size_type sVar7;
  uv_stream_t *puVar8;
  uv_loop_t *puVar9;
  __0 local_149;
  undefined8 local_148;
  uv_stream_t *puStack_140;
  undefined4 local_12c;
  type local_128;
  ProcessData *prev;
  anon_union_8_2_26168aa3_for_data local_118;
  undefined1 local_110 [8];
  array<uv_stdio_container_s,_3UL> stdio;
  value_type local_d8;
  reference local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> arguments;
  uv_process_options_t options;
  ProcessData *process;
  unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
  local_30;
  byte local_22;
  byte local_21;
  bool last_local;
  ProcessConfiguration *pPStack_20;
  bool first_local;
  ProcessConfiguration *config_local;
  InternalData *this_local;
  
  local_22 = last;
  local_21 = first;
  pPStack_20 = config;
  config_local = (ProcessConfiguration *)this;
  std::make_unique<cmUVProcessChain::InternalData::ProcessData>();
  std::
  vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
  ::
  emplace_back<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>
            ((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
              *)&this->Processes,&local_30);
  std::
  unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
  ::~unique_ptr(&local_30);
  pvVar5 = std::
           vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
           ::back(&this->Processes);
  data = std::
         unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
         ::operator*(pvVar5);
  data->Data = this;
  memset(&arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,0,0x50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&pPStack_20->Arguments,0);
  std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
  this_00 = pPStack_20;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pPStack_20->Arguments);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this_00->Arguments);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar3) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_d8 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,&local_d8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  stdio._M_elems[2].data.stream = (uv_stream_t *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
             (value_type *)&stdio._M_elems[2].data.stream);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::data
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
  memset(&prev,0,0x10);
  pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                     ((array<uv_stdio_container_s,_3UL> *)local_110,0);
  *(ProcessData **)pvVar6 = prev;
  pvVar6->data = local_118;
  if ((local_21 & 1) == 0) {
    sVar7 = std::
            vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
            ::size(&this->Processes);
    if (sVar7 < 2) {
      __assert_fail("this->Processes.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmUVProcessChain.cxx"
                    ,0xff,
                    "bool cmUVProcessChain::InternalData::AddCommand(const cmUVProcessChainBuilder::ProcessConfiguration &, bool, bool)"
                   );
    }
    sVar7 = std::
            vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
            ::size(&this->Processes);
    pvVar5 = std::
             vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
             ::operator[](&this->Processes,sVar7 - 2);
    local_128 = std::
                unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                ::operator*(pvVar5);
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    pvVar6->flags = UV_INHERIT_STREAM;
    puVar8 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&local_128->OutputPipe);
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    (pvVar6->data).stream = puVar8;
  }
  else {
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    pvVar6->flags = UV_IGNORE;
  }
  if ((local_22 & 1) == 0) {
    puVar9 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    iVar4 = ::cm::uv_pipe_ptr::init(&data->OutputPipe,(EVP_PKEY_CTX *)puVar9);
    if (iVar4 < 0) {
      this_local._7_1_ = false;
      goto LAB_005a6f36;
    }
    local_148 = 0;
    puStack_140 = (uv_stream_t *)0x0;
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    *(undefined8 *)pvVar6 = local_148;
    (pvVar6->data).stream = puStack_140;
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    pvVar6->flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
    puVar8 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&data->OutputPipe);
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    (pvVar6->data).stream = puVar8;
  }
  else {
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    uVar2 = *(undefined4 *)&(this->OutputStreamData).super_BasicStreamData.Stdio.field_0x4;
    pvVar6->flags = (this->OutputStreamData).super_BasicStreamData.Stdio.flags;
    *(undefined4 *)&pvVar6->field_0x4 = uVar2;
    pvVar6->data = (this->OutputStreamData).super_BasicStreamData.Stdio.data;
  }
  pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                     ((array<uv_stdio_container_s,_3UL> *)local_110,2);
  uVar2 = *(undefined4 *)&(this->ErrorStreamData).super_BasicStreamData.Stdio.field_0x4;
  aVar1 = (this->ErrorStreamData).super_BasicStreamData.Stdio.data;
  pvVar6->flags = (this->ErrorStreamData).super_BasicStreamData.Stdio.flags;
  *(undefined4 *)&pvVar6->field_0x4 = uVar2;
  pvVar6->data = aVar1;
  std::array<uv_stdio_container_s,_3UL>::data((array<uv_stdio_container_s,_3UL> *)local_110);
  arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)AddCommand(cmUVProcessChainBuilder::ProcessConfiguration_const&,bool,bool)::$_0::
                operator_cast_to_function_pointer(&local_149);
  puVar9 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
  iVar4 = ::cm::uv_process_ptr::spawn
                    (&data->Process,puVar9,
                     (uv_process_options_t *)
                     &arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,data);
  this_local._7_1_ = -1 < iVar4;
LAB_005a6f36:
  local_12c = 1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmUVProcessChain::InternalData::AddCommand(
  const cmUVProcessChainBuilder::ProcessConfiguration& config, bool first,
  bool last)
{
  this->Processes.emplace_back(cm::make_unique<ProcessData>());
  auto& process = *this->Processes.back();
  process.Data = this;

  auto options = uv_process_options_t();

  // Bounds were checked at add time, first element is guaranteed to exist
  options.file = config.Arguments[0].c_str();

  std::vector<const char*> arguments;
  for (auto const& arg : config.Arguments) {
    arguments.push_back(arg.c_str());
  }
  arguments.push_back(nullptr);
  options.args = const_cast<char**>(arguments.data());
  options.flags = UV_PROCESS_WINDOWS_HIDE;

  std::array<uv_stdio_container_t, 3> stdio;
  stdio[0] = uv_stdio_container_t();
  if (first) {
    stdio[0].flags = UV_IGNORE;
  } else {
    assert(this->Processes.size() >= 2);
    auto& prev = *this->Processes[this->Processes.size() - 2];
    stdio[0].flags = UV_INHERIT_STREAM;
    stdio[0].data.stream = prev.OutputPipe;
  }
  if (last) {
    stdio[1] = this->OutputStreamData.Stdio;
  } else {
    if (process.OutputPipe.init(*this->Loop, 0) < 0) {
      return false;
    }
    stdio[1] = uv_stdio_container_t();
    stdio[1].flags =
      static_cast<uv_stdio_flags>(UV_CREATE_PIPE | UV_WRITABLE_PIPE);
    stdio[1].data.stream = process.OutputPipe;
  }
  stdio[2] = this->ErrorStreamData.Stdio;

  options.stdio = stdio.data();
  options.stdio_count = 3;
  options.exit_cb = [](uv_process_t* handle, int64_t exitStatus,
                       int termSignal) {
    auto* processData = static_cast<ProcessData*>(handle->data);
    processData->Finished = true;
    processData->ProcessStatus.ExitStatus = exitStatus;
    processData->ProcessStatus.TermSignal = termSignal;
    processData->Data->ProcessesCompleted++;
  };

  return process.Process.spawn(*this->Loop, options, &process) >= 0;
}